

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_last(lyxp_set **UNUSED_args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *ctx;
  char *pcVar1;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t UNUSED_arg_count_local;
  lyxp_set **UNUSED_args_local;
  
  if ((options & 0x1c) == 0) {
    if (set->type == LYXP_SET_NODE_SET) {
      if (set->used == 0) {
        set_fill_number(set,(longdouble)0);
        UNUSED_args_local._4_4_ = LY_SUCCESS;
      }
      else {
        set_fill_number(set,(longdouble)set->ctx_size);
        UNUSED_args_local._4_4_ = LY_SUCCESS;
      }
    }
    else {
      ctx = set->ctx;
      pcVar1 = print_set_type(set);
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Invalid context type %s in %s.",pcVar1,"last()");
      UNUSED_args_local._4_4_ = LY_EVALID;
    }
  }
  else {
    set_scnode_clear_ctx(set,0);
    UNUSED_args_local._4_4_ = LY_SUCCESS;
  }
  return UNUSED_args_local._4_4_;
}

Assistant:

static LY_ERR
xpath_last(struct lyxp_set **UNUSED(args), uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INCTX, print_set_type(set), "last()");
        return LY_EVALID;
    } else if (!set->used) {
        set_fill_number(set, 0);
        return LY_SUCCESS;
    }

    set_fill_number(set, set->ctx_size);
    return LY_SUCCESS;
}